

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O3

void __thiscall runtime::VirtualMachine::LoadFloatConstant(VirtualMachine *this)

{
  element_type *peVar1;
  pointer pdVar2;
  element_type *peVar3;
  size_t sVar4;
  Variable v;
  string local_40;
  
  sVar4 = getByteCodeParameter(this);
  peVar1 = (this->file).super___shared_ptr<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  pdVar2 = (peVar1->floatConstants).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (sVar4 < (ulong)((long)(peVar1->floatConstants).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)pdVar2 >> 3)) {
    v.field_1.integerValue =
         ((anon_union_8_6_52c89740_for_Variable_1 *)(pdVar2 + sVar4))->integerValue;
    v._0_8_ = 3;
    pushOpStack(this,v);
    peVar3 = (this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    peVar3->programCounter = peVar3->programCounter + 1;
    return;
  }
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Index out of bounds in LoadFloatConstant","");
  panic(this,&local_40);
}

Assistant:

void runtime::VirtualMachine::LoadFloatConstant() {
  std::size_t index = this->getByteCodeParameter();

  if (index >= this->file->floatConstants.size()) {
    this->panic("Index out of bounds in LoadFloatConstant");
    return;
  }

  this->pushFloat(this->file->floatConstants.at(index));

  this->advance();
}